

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall FactoredDecPOMDPDiscrete::SoftPrint_abi_cxx11_(FactoredDecPOMDPDiscrete *this)

{
  FactoredDecPOMDPDiscrete *in_stack_00000278;
  
  SoftPrint_abi_cxx11_(in_stack_00000278);
  return;
}

Assistant:

string FactoredDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint();
    ss << DecPOMDP::SoftPrint();
    ss << "FactoredDecPOMDPDiscrete contains " << _m_nrLRFs
       << " local reward functions." << endl;
    for(Index i=0;i!=_m_nrLRFs;++i)
    {
        ss << "LRF " << i << " statefactor scope " << _m_sfScopes.at(i)
           << " agent scope " << _m_agScopes.at(i) << endl;
        ss << _m_LRFs.at(i)->SoftPrint() << endl;
    }
    
    //print components specific to FactoredDecPOMDPDiscrete:
    return(ss.str());
}